

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::AssertionPrinter::printSourceInfo(AssertionPrinter *this)

{
  ostream *os;
  Colour colourGuard;
  SourceLineInfo local_20;
  
  colourGuard.m_moved = false;
  Colour::use(FileName);
  os = this->stream;
  local_20.file = (this->result->m_info).lineInfo.file;
  local_20.line = (this->result->m_info).lineInfo.line;
  operator<<(os,&local_20);
  std::operator<<(os,": ");
  Colour::~Colour(&colourGuard);
  return;
}

Assistant:

void printSourceInfo() const {
                Colour colourGuard( Colour::FileName );
                stream << result.getSourceInfo() << ": ";
            }